

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O0

char * cmime_flbi_scan_postface(char *s,CMimeMessage_T *msg)

{
  CMimeList_T *pCVar1;
  CMimeListElem_T *pCVar2;
  int iVar3;
  _BoundaryInfo_T *__ptr;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  _BoundaryInfo_T *__ptr_00;
  bool bVar7;
  int match;
  CMimePart_T *part;
  CMimeListElem_T *elem;
  int offset;
  int count;
  char *t;
  _BoundaryInfo_T *nxt_info;
  char *nxt;
  char *postface;
  char *boundary;
  _BoundaryInfo_T *info;
  char *it;
  CMimeMessage_T *msg_local;
  char *s_local;
  
  nxt = (char *)0x0;
  elem._4_4_ = 0;
  info = (_BoundaryInfo_T *)s;
  do {
    info = (_BoundaryInfo_T *)strstr((char *)info,"--");
    if (info == (_BoundaryInfo_T *)0x0) {
      if (nxt == (char *)0x0) {
        nxt = strdup(s);
      }
      return nxt;
    }
    __ptr = _cmime_internal_get_boundary_info(msg->boundaries,(char *)info,msg->linebreak);
    if (__ptr != (_BoundaryInfo_T *)0x0) {
      if (__ptr->type == CMIME_BOUNDARY_CLOSE) {
        if (elem._4_4_ == 0) {
          sVar4 = strlen(s);
          sVar5 = strlen((char *)info);
          iVar3 = (int)sVar4 - (int)sVar5;
          nxt = (char *)calloc((long)iVar3 + 1,1);
          strncpy(nxt,s,(long)iVar3);
          sVar4 = strlen(nxt);
          nxt[sVar4] = '\0';
          elem._4_4_ = 1;
        }
        pcVar6 = strstr((char *)((long)&info->type + __ptr->len),"--");
        if (pcVar6 == (char *)0x0) {
          info = (_BoundaryInfo_T *)((long)&info->type + __ptr->len);
          sVar4 = strlen(s);
          sVar5 = strlen((char *)info);
          elem._0_4_ = (int)sVar4 - (int)sVar5;
        }
        else {
          __ptr_00 = _cmime_internal_get_boundary_info(msg->boundaries,pcVar6,msg->linebreak);
          if (__ptr_00 == (_BoundaryInfo_T *)0x0) {
            sVar4 = strlen(s);
            sVar5 = strlen((char *)info);
            elem._0_4_ = (int)sVar4 - (int)sVar5;
          }
          else {
            info = (_BoundaryInfo_T *)((long)&info->type + __ptr_00->len);
            sVar4 = strlen((char *)info);
            sVar5 = strlen(pcVar6);
            elem._0_4_ = (int)sVar4 - (int)sVar5;
            free(__ptr_00->marker);
            free(__ptr_00);
          }
        }
        pcVar6 = __ptr->marker;
        for (part = (CMimePart_T *)msg->parts->tail; part != (CMimePart_T *)0x0;
            part = (CMimePart_T *)part->content) {
          pCVar1 = part->headers;
          bVar7 = false;
          if (pCVar1->tail != (CMimeListElem_T *)0x0) {
            pCVar2 = pCVar1->tail;
            sVar4 = strlen((char *)pCVar1->tail);
            iVar3 = strncmp((char *)pCVar2,pcVar6 + 2,sVar4);
            bVar7 = iVar3 == 0;
          }
          if (pCVar1->head != (CMimeListElem_T *)0x0) {
            pCVar2 = pCVar1->head;
            sVar4 = strlen((char *)pCVar1->head);
            iVar3 = strncmp((char *)pCVar2,pcVar6 + 2,sVar4);
            if (iVar3 == 0) {
              bVar7 = true;
            }
          }
          if (bVar7) {
            if (*(long *)(pCVar1 + 1) != 0) {
              free(*(void **)(pCVar1 + 1));
            }
            pcVar6 = (char *)calloc((long)(int)elem + 1,1);
            strncpy(pcVar6,(char *)info,(long)(int)elem);
            sVar4 = strlen(pcVar6);
            pcVar6[sVar4] = '\0';
            *(char **)(pCVar1 + 1) = pcVar6;
            *(undefined2 *)&pCVar1[1].destroy = 1;
            break;
          }
        }
      }
      elem._4_4_ = elem._4_4_ + 1;
      free(__ptr->marker);
      free(__ptr);
    }
    info = (_BoundaryInfo_T *)((long)&info->type + 1);
  } while( true );
}

Assistant:

char *cmime_flbi_scan_postface(char *s, CMimeMessage_T *msg) {
    char *it = s;
    _BoundaryInfo_T *info = NULL;
    char *boundary;
    char *postface = NULL;
    char *nxt = NULL;
    _BoundaryInfo_T *nxt_info = NULL;
    char *t = NULL;
    int count;
    int offset = 0;
    CMimeListElem_T *elem = NULL;
    CMimePart_T *part = NULL;
    int match = 0;

    count = 0;
    while((it = strstr(it,"--"))!=NULL) {
        info = _cmime_internal_get_boundary_info(msg->boundaries,it,msg->linebreak);
        if (info!=NULL) {
            //len = strlen(marker);
            //if ((marker[len-2]=='-')&&(marker[len-1]=='-')) {
            if (info->type == CMIME_BOUNDARY_CLOSE) {
                if (count == 0) {
                    offset = strlen(s) - strlen(it);
                    postface = (char *)calloc(offset + sizeof(char),sizeof(char));
                    strncpy(postface,s,offset);
                    postface[strlen(postface)] = '\0';
                    count++;
                } 
                nxt = it + info->len;
                if ((nxt = strstr(nxt,"--"))!=NULL) { 
                    if ((nxt_info = _cmime_internal_get_boundary_info(msg->boundaries,nxt,msg->linebreak))!=NULL) {  
                        it = it + nxt_info->len;
                        offset = strlen(it) - strlen(nxt); 
                        free(nxt_info->marker);
                        free(nxt_info);
                        nxt_info = NULL;
                    } else
                        offset = strlen(s) - strlen(it);
                } else {
                    it = it + info->len;
                    offset = strlen(s) - strlen(it);
                }

                /* jump over 2 starting - chars for boundary comparsion */
                boundary = info->marker;
                boundary += 2 * sizeof(char);
                /* find mime part which belongs to this boundary */
                elem = cmime_list_tail(msg->parts);
                while(elem!=NULL) {
                    part = (CMimePart_T *)cmime_list_data(elem);
                    match = 0;
                    if (part->parent_boundary!=NULL) {
                        if (strncmp(part->parent_boundary,boundary,strlen(part->parent_boundary))==0) 
                            match = 1;
                    }

                    if (part->boundary!=NULL) {
                        if (strncmp(part->boundary,boundary,strlen(part->boundary))==0) 
                            match = 1;
                    }
                    
                    if (match == 1) {
                        if (part->postface!=NULL)
                            free(part->postface);

                        t = (char *)calloc(offset + sizeof(char),sizeof(char));
                        strncpy(t,it,offset);
                        t[strlen(t)] = '\0';
                        part->postface = t;
                        part->last = 1;
                        break;
                   } 
                    
                    elem = elem->prev;
                }
            }
            count++;
            free(info->marker);
            free(info);
            info = NULL;
        }
        
        it++;
    }
    
    if (postface==NULL)
        postface = strdup(s);
    return(postface);
}